

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O0

int ddSecDiffCheck(DdManager *table,int x,int y)

{
  int iVar1;
  double dVar2;
  int yindex;
  int xindex;
  double threshold;
  double Sx;
  double Nx_1;
  double Nx;
  int y_local;
  int x_local;
  DdManager *table_local;
  
  if (x == 0) {
    table_local._4_4_ = 0;
  }
  else {
    dVar2 = (double)table->subtables[x].keys;
    if ((double)table->recomb / 100.0 <=
        (double)table->subtables[y].keys / dVar2 - dVar2 / (double)table->subtables[x + -1].keys) {
      table_local._4_4_ = 0;
    }
    else {
      iVar1 = cuddTestInteract(table,table->invperm[x],table->invperm[y]);
      if (iVar1 == 0) {
        table_local._4_4_ = 0;
      }
      else {
        table_local._4_4_ = 1;
      }
    }
  }
  return table_local._4_4_;
}

Assistant:

static int
ddSecDiffCheck(
  DdManager * table,
  int  x,
  int  y)
{
    double Nx,Nx_1;
    double Sx;
    double threshold;
    int    xindex,yindex;

    if (x==0) return(0);

#ifdef DD_STATS
    secdiffcalls++;
#endif
    Nx = (double) table->subtables[x].keys;
    Nx_1 = (double) table->subtables[x-1].keys;
    Sx = (table->subtables[y].keys/Nx) - (Nx/Nx_1);

    threshold = table->recomb / 100.0;
    if (Sx < threshold) {
        xindex = table->invperm[x];
        yindex = table->invperm[y];
        if (cuddTestInteract(table,xindex,yindex)) {
#if defined(DD_DEBUG) && defined(DD_VERBOSE)
            (void) fprintf(table->out,
                           "Second difference for %d = %g Pos(%d)\n",
                           table->invperm[x],Sx,x);
#endif
#ifdef DD_STATS
            secdiff++;
#endif
            return(1);
        } else {
#ifdef DD_STATS
            secdiffmisfire++;
#endif
            return(0);
        }

    }
    return(0);

}